

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::Solver(Solver *this)

{
  int iVar1;
  double *pdVar2;
  int32_t *piVar3;
  uint *puVar4;
  bool *pbVar5;
  char **ppcVar6;
  FILE *pFVar7;
  VarOrderLt local_38;
  WatcherDeleted local_30;
  WatcherDeleted local_28 [3];
  Solver *local_10;
  Solver *this_local;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_00f99b08;
  this->SolverType = 0;
  this->pCnfFunc = (_func_int_void_ptr_int_int_ptr *)0x0;
  this->nCallConfl = 1000;
  this->terminate_search_early = false;
  this->pstop = (int *)0x0;
  this->nRuntimeLimit = 0;
  local_10 = this;
  vec<int>::vec(&this->user_vec);
  vec<Gluco::Lit>::vec(&this->user_lits);
  vec<Gluco::lbool>::vec(&this->model);
  vec<Gluco::Lit>::vec(&this->conflict);
  this->verbosity = 0;
  this->verbEveryConflicts = 10000;
  this->showModel = 0;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_K);
  this->K = *pdVar2;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_R);
  this->R = *pdVar2;
  piVar3 = IntOption::operator_cast_to_int_(&opt_size_lbd_queue);
  this->sizeLBDQueue = (double)*piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_size_trail_queue);
  this->sizeTrailQueue = (double)*piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_first_reduce_db);
  this->firstReduceDB = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_inc_reduce_db);
  this->incReduceDB = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_spec_inc_reduce_db);
  this->specialIncReduceDB = *piVar3;
  puVar4 = (uint *)IntOption::operator_cast_to_int_(&opt_lb_lbd_frozen_clause);
  this->lbLBDFrozenClause = *puVar4;
  piVar3 = IntOption::operator_cast_to_int_(&opt_lb_size_minimzing_clause);
  this->lbSizeMinimizingClause = *piVar3;
  puVar4 = (uint *)IntOption::operator_cast_to_int_(&opt_lb_lbd_minimzing_clause);
  this->lbLBDMinimizingClause = *puVar4;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_var_decay);
  this->var_decay = *pdVar2;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_clause_decay);
  this->clause_decay = *pdVar2;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_random_var_freq);
  this->random_var_freq = *pdVar2;
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_random_seed);
  this->random_seed = *pdVar2;
  piVar3 = IntOption::operator_cast_to_int_(&opt_ccmin_mode);
  this->ccmin_mode = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_phase_saving);
  this->phase_saving = *piVar3;
  this->rnd_pol = false;
  pbVar5 = BoolOption::operator_cast_to_bool_(&opt_rnd_init_act);
  this->rnd_init_act = (bool)(*pbVar5 & 1);
  pdVar2 = DoubleOption::operator_cast_to_double_(&opt_garbage_frac);
  this->garbage_frac = *pdVar2;
  this->certifiedOutput = (FILE *)0x0;
  pbVar5 = BoolOption::operator_cast_to_bool_(&opt_certified_);
  this->certifiedUNSAT = (bool)(*pbVar5 & 1);
  this->nbRemovedClauses = 0;
  this->nbReducedClauses = 0;
  this->nbDL2 = 0;
  this->nbBin = 0;
  this->nbUn = 0;
  this->nbReduceDB = 0;
  this->solves = 0;
  this->starts = 0;
  this->decisions = 0;
  this->rnd_decisions = 0;
  this->propagations = 0;
  this->conflicts = 0;
  this->conflictsRestarts = 0;
  this->nbstopsrestarts = 0;
  this->nbstopsrestartssame = 0;
  this->lastblockatrestart = 0;
  this->dec_vars = 0;
  this->clauses_literals = 0;
  this->learnts_literals = 0;
  this->max_literals = 0;
  this->tot_literals = 0;
  this->curRestart = 1;
  this->ok = true;
  this->cla_inc = 1.0;
  vec<double>::vec(&this->activity);
  this->var_inc = 1.0;
  WatcherDeleted::WatcherDeleted(local_28,&this->ca);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::OccLists
            (&this->watches,local_28);
  WatcherDeleted::WatcherDeleted(&local_30,&this->ca);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::OccLists
            (&this->watchesBin,&local_30);
  vec<unsigned_int>::vec(&this->clauses);
  vec<unsigned_int>::vec(&this->learnts);
  vec<Gluco::lbool>::vec(&this->assigns);
  vec<char>::vec(&this->polarity);
  vec<char>::vec(&this->decision);
  vec<Gluco::Lit>::vec(&this->trail);
  vec<int>::vec(&this->nbpos);
  vec<int>::vec(&this->trail_lim);
  vec<Gluco::Solver::VarData>::vec(&this->vardata);
  this->qhead = 0;
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  vec<Gluco::Lit>::vec(&this->assumptions);
  VarOrderLt::VarOrderLt(&local_38,&this->activity);
  Heap<Gluco::Solver::VarOrderLt>::Heap(&this->order_heap,&local_38);
  this->progress_estimate = 0.0;
  this->remove_satisfied = true;
  vec<unsigned_int>::vec(&this->permDiff);
  vec<Gluco::Lit>::vec(&this->lastDecisionLevel);
  ClauseAllocator::ClauseAllocator(&this->ca);
  bqueue<unsigned_int>::bqueue(&this->trailQueue);
  bqueue<unsigned_int>::bqueue(&this->lbdQueue);
  vec<char>::vec(&this->seen);
  vec<Gluco::Lit>::vec(&this->analyze_stack);
  vec<Gluco::Lit>::vec(&this->analyze_toclear);
  vec<Gluco::Lit>::vec(&this->add_tmp);
  this->conflict_budget = -1;
  this->propagation_budget = -1;
  this->asynch_interrupt = false;
  pbVar5 = BoolOption::operator_cast_to_bool_(&opt_incremental);
  this->incremental = *pbVar5 & 1;
  this->nbVarsInitialFormula = 0x7fffffff;
  vec<int>::vec(&this->assumptionPositions);
  vec<int>::vec(&this->initialPositions);
  this->MYFLAG = 0;
  bqueue<unsigned_int>::initSize(&this->lbdQueue,(int)this->sizeLBDQueue);
  bqueue<unsigned_int>::initSize(&this->trailQueue,(int)this->sizeTrailQueue);
  this->sumLBD = 0.0;
  this->nbclausesbeforereduce = this->firstReduceDB;
  this->totalTime4Sat = 0.0;
  this->totalTime4Unsat = 0.0;
  this->nbSatCalls = 0;
  this->nbUnsatCalls = 0;
  if ((this->certifiedUNSAT & 1U) != 0) {
    ppcVar6 = StringOption::operator_cast_to_char__(&opt_certified_file_);
    iVar1 = strcmp(*ppcVar6,"NULL");
    if (iVar1 == 0) {
      pFVar7 = fopen("/dev/stdout","wb");
      this->certifiedOutput = (FILE *)pFVar7;
    }
    else {
      ppcVar6 = StringOption::operator_cast_to_char__(&opt_certified_file_);
      pFVar7 = fopen(*ppcVar6,"wb");
      this->certifiedOutput = (FILE *)pFVar7;
    }
  }
  return;
}

Assistant:

Solver::Solver() :

    // Parameters (user settable):
    //
    SolverType(0)
    , pCnfFunc(NULL)
    , nCallConfl(1000)
    , terminate_search_early(false)
    , pstop(NULL)
    , nRuntimeLimit(0)

    , verbosity      (0)
    , verbEveryConflicts(10000)
    , showModel      (0)
    , K              (opt_K)
    , R              (opt_R)
    , sizeLBDQueue   (opt_size_lbd_queue)
    , sizeTrailQueue   (opt_size_trail_queue)
    , firstReduceDB  (opt_first_reduce_db)
    , incReduceDB    (opt_inc_reduce_db)
    , specialIncReduceDB    (opt_spec_inc_reduce_db)
    , lbLBDFrozenClause (opt_lb_lbd_frozen_clause)
    , lbSizeMinimizingClause (opt_lb_size_minimzing_clause)
    , lbLBDMinimizingClause (opt_lb_lbd_minimzing_clause)
  , var_decay        (opt_var_decay)
  , clause_decay     (opt_clause_decay)
  , random_var_freq  (opt_random_var_freq)
  , random_seed      (opt_random_seed)
  , ccmin_mode       (opt_ccmin_mode)
  , phase_saving     (opt_phase_saving)
  , rnd_pol          (false)
  , rnd_init_act     (opt_rnd_init_act)
  , garbage_frac     (opt_garbage_frac)
  , certifiedOutput  (NULL)
  , certifiedUNSAT   (opt_certified_) 
    // Statistics: (formerly in 'SolverStats')
    //
  ,  nbRemovedClauses(0),nbReducedClauses(0), nbDL2(0),nbBin(0),nbUn(0) , nbReduceDB(0)
    , solves(0), starts(0), decisions(0), rnd_decisions(0), propagations(0),conflicts(0),conflictsRestarts(0),nbstopsrestarts(0),nbstopsrestartssame(0),lastblockatrestart(0)
  , dec_vars(0), clauses_literals(0), learnts_literals(0), max_literals(0), tot_literals(0)
    , curRestart(1)

  , ok                 (true)
  , cla_inc            (1)
  , var_inc            (1)
  , watches            (WatcherDeleted(ca))
  , watchesBin            (WatcherDeleted(ca))
  , qhead              (0)
  , simpDB_assigns     (-1)
  , simpDB_props       (0)
  , order_heap         (VarOrderLt(activity))
  , progress_estimate  (0)
  , remove_satisfied   (true)

    // Resource constraints:
    //
  , conflict_budget    (-1)
  , propagation_budget (-1)
  , asynch_interrupt   (false)
  , incremental(opt_incremental)
  , nbVarsInitialFormula(INT32_MAX)
{
  MYFLAG=0;  
  // Initialize only first time. Useful for incremental solving, useless otherwise
  lbdQueue.initSize(sizeLBDQueue);
  trailQueue.initSize(sizeTrailQueue);
  sumLBD = 0;
  nbclausesbeforereduce = firstReduceDB;
  totalTime4Sat=0;totalTime4Unsat=0;
  nbSatCalls=0;nbUnsatCalls=0;


  if(certifiedUNSAT) {
    if(!strcmp(opt_certified_file_,"NULL")) {
      certifiedOutput =  fopen("/dev/stdout", "wb");
    } else {
      certifiedOutput =  fopen(opt_certified_file_, "wb");           
    }
    //    fprintf(certifiedOutput,"o proof DRUP\n");
  }
}